

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_fma_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [24];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [32];
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_rpow op;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z_1;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_2;
  v4si emm0;
  int local_22f4;
  undefined8 *local_22e0;
  undefined8 *local_22d0;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  float local_21a0;
  float fStack_219c;
  float fStack_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  float fStack_2188;
  float local_2180;
  float fStack_217c;
  float fStack_2178;
  float fStack_2174;
  float fStack_2170;
  float fStack_216c;
  float fStack_2168;
  undefined4 uStack_2164;
  undefined1 local_2140 [8];
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined1 local_20a0 [8];
  float fStack_2098;
  float fStack_2094;
  undefined1 local_2080 [8];
  float fStack_2078;
  float fStack_2074;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  float local_2040;
  float fStack_203c;
  float fStack_2038;
  float fStack_2034;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  float local_1f80;
  float fStack_1f7c;
  float fStack_1f78;
  float fStack_1f74;
  undefined1 local_1ee0 [8];
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1e60 [8];
  float fStack_1e58;
  float fStack_1e54;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1de0 [8];
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  undefined8 local_c40;
  undefined8 uStack_c38;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ad0 [8];
  undefined8 uStack_ac8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined8 local_a70;
  undefined8 uStack_a68;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_920 [8];
  undefined8 uStack_918;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  
  local_22f4 = 0;
  uVar1 = *in_RSI;
  auVar3 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x30);
  auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
  uStack_2230 = auVar3._0_8_;
  uStack_2228 = auVar3._8_8_;
  local_22e0 = in_RDX;
  local_22d0 = in_RDI;
  for (; local_22f4 + 7 < in_ECX * in_R8D; local_22f4 = local_22f4 + 8) {
    auVar75._16_8_ = uStack_2230;
    auVar75._0_16_ = auVar4;
    auVar75._24_8_ = uStack_2228;
    auVar74._16_8_ = uStack_2230;
    auVar74._0_16_ = auVar4;
    auVar74._24_8_ = uStack_2228;
    auVar2 = vcmpps_avx(auVar74,ZEXT1632(ZEXT816(0)),2);
    auVar6._8_8_ = 0x80000000800000;
    auVar6._0_8_ = 0x80000000800000;
    auVar6._16_8_ = 0x80000000800000;
    auVar6._24_8_ = 0x80000000800000;
    auVar5 = vmaxps_avx(auVar75,auVar6);
    auVar3 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
    auVar8 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
    auVar12._8_8_ = 0x807fffff807fffff;
    auVar12._0_8_ = 0x807fffff807fffff;
    auVar12._16_8_ = 0x807fffff807fffff;
    auVar12._24_8_ = 0x807fffff807fffff;
    auVar5 = vandps_avx(auVar5,auVar12);
    auVar35._8_8_ = 0x3f0000003f000000;
    auVar35._0_8_ = 0x3f0000003f000000;
    auVar35._16_8_ = 0x3f0000003f000000;
    auVar35._24_8_ = 0x3f0000003f000000;
    auVar6 = vorps_avx(auVar5,auVar35);
    auVar38._8_8_ = 0x7f0000007f;
    auVar38._0_8_ = 0x7f0000007f;
    auVar3 = vpsubd_avx(auVar3,auVar38);
    auVar37._8_8_ = 0x7f0000007f;
    auVar37._0_8_ = 0x7f0000007f;
    auVar8 = vpsubd_avx(auVar8,auVar37);
    local_c40 = auVar8._0_8_;
    uStack_c38 = auVar8._8_8_;
    auVar36._16_8_ = local_c40;
    auVar36._0_16_ = auVar3;
    auVar36._24_8_ = uStack_c38;
    auVar5 = vcvtdq2ps_avx(auVar36);
    local_1d20 = auVar5._0_4_;
    fStack_1d1c = auVar5._4_4_;
    fStack_1d18 = auVar5._8_4_;
    fStack_1d14 = auVar5._12_4_;
    fStack_1d10 = auVar5._16_4_;
    fStack_1d0c = auVar5._20_4_;
    fStack_1d08 = auVar5._24_4_;
    fStack_1d04 = auVar5._28_4_;
    local_1e60._4_4_ = fStack_1d1c + 1.0;
    local_1e60._0_4_ = local_1d20 + 1.0;
    fStack_1e58 = fStack_1d18 + 1.0;
    fStack_1e54 = fStack_1d14 + 1.0;
    uStack_1e50._0_4_ = fStack_1d10 + 1.0;
    uStack_1e50._4_4_ = fStack_1d0c + 1.0;
    uStack_1e48._0_4_ = fStack_1d08 + 1.0;
    uStack_1e48._4_4_ = fStack_1d04 + 1.0;
    auVar9 = _local_1e60;
    auVar80 = vcmpps_avx(auVar6,_DAT_01f92720,1);
    auVar5 = vandps_avx(auVar6,auVar80);
    auVar10._8_8_ = 0x3f8000003f800000;
    auVar10._0_8_ = 0x3f8000003f800000;
    auVar10._16_8_ = 0x3f8000003f800000;
    auVar10._24_8_ = 0x3f8000003f800000;
    auVar6 = vsubps_avx(auVar6,auVar10);
    uStack_1e48 = auVar9._24_8_;
    auVar11._8_8_ = 0x3f8000003f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._16_8_ = 0x3f8000003f800000;
    auVar11._24_8_ = 0x3f8000003f800000;
    auVar80 = vandps_avx(auVar11,auVar80);
    auVar9._16_8_ = uStack_1e50;
    auVar9._0_16_ = _local_1e60;
    auVar9._24_8_ = uStack_1e48;
    auVar80 = vsubps_avx(auVar9,auVar80);
    local_1d60 = auVar6._0_4_;
    fStack_1d5c = auVar6._4_4_;
    fStack_1d58 = auVar6._8_4_;
    fStack_1d54 = auVar6._12_4_;
    fStack_1d50 = auVar6._16_4_;
    fStack_1d4c = auVar6._20_4_;
    fStack_1d48 = auVar6._24_4_;
    fStack_1d44 = auVar6._28_4_;
    local_1d80 = auVar5._0_4_;
    fStack_1d7c = auVar5._4_4_;
    fStack_1d78 = auVar5._8_4_;
    fStack_1d74 = auVar5._12_4_;
    fStack_1d70 = auVar5._16_4_;
    fStack_1d6c = auVar5._20_4_;
    fStack_1d68 = auVar5._24_4_;
    fStack_1d64 = auVar5._28_4_;
    local_1de0._0_4_ = local_1d60 + local_1d80;
    local_1de0._4_4_ = fStack_1d5c + fStack_1d7c;
    fStack_1dd8 = fStack_1d58 + fStack_1d78;
    fStack_1dd4 = fStack_1d54 + fStack_1d74;
    fStack_1dd0 = fStack_1d50 + fStack_1d70;
    fStack_1dcc = fStack_1d4c + fStack_1d6c;
    fStack_1dc8 = fStack_1d48 + fStack_1d68;
    fStack_1dc4 = fStack_1d44 + fStack_1d64;
    uStack_1ed8 = 0x3d9021bb3d9021bb;
    local_1ee0 = (undefined1  [8])0x3d9021bb3d9021bb;
    uStack_1ed0 = 0x3d9021bb3d9021bb;
    uStack_1ec8 = 0x3d9021bb3d9021bb;
    auVar21._8_4_ = -0.1151461;
    auVar21._12_4_ = -0.1151461;
    auVar21._0_4_ = -0.1151461;
    auVar21._4_4_ = -0.1151461;
    auVar21._16_4_ = -0.1151461;
    auVar21._20_4_ = -0.1151461;
    auVar21._24_4_ = -0.1151461;
    auVar21._28_4_ = -0.1151461;
    auVar3 = vfmadd213ps_fma(_local_1de0,_local_1ee0,auVar21);
    auVar22._8_4_ = 0.116769984;
    auVar22._12_4_ = 0.116769984;
    auVar22._0_4_ = 0.116769984;
    auVar22._4_4_ = 0.116769984;
    auVar22._16_4_ = 0.116769984;
    auVar22._20_4_ = 0.116769984;
    auVar22._24_4_ = 0.116769984;
    auVar22._28_4_ = 0.116769984;
    auVar3 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar3),auVar22);
    auVar23._8_4_ = -0.12420141;
    auVar23._12_4_ = -0.12420141;
    auVar23._0_4_ = -0.12420141;
    auVar23._4_4_ = -0.12420141;
    auVar23._16_4_ = -0.12420141;
    auVar23._20_4_ = -0.12420141;
    auVar23._24_4_ = -0.12420141;
    auVar23._28_4_ = -0.12420141;
    auVar3 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar3),auVar23);
    auVar24._8_4_ = 0.14249323;
    auVar24._12_4_ = 0.14249323;
    auVar24._0_4_ = 0.14249323;
    auVar24._4_4_ = 0.14249323;
    auVar24._16_4_ = 0.14249323;
    auVar24._20_4_ = 0.14249323;
    auVar24._24_4_ = 0.14249323;
    auVar24._28_4_ = 0.14249323;
    auVar3 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar3),auVar24);
    auVar25._8_4_ = -0.16668057;
    auVar25._12_4_ = -0.16668057;
    auVar25._0_4_ = -0.16668057;
    auVar25._4_4_ = -0.16668057;
    auVar25._16_4_ = -0.16668057;
    auVar25._20_4_ = -0.16668057;
    auVar25._24_4_ = -0.16668057;
    auVar25._28_4_ = -0.16668057;
    auVar3 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar3),auVar25);
    auVar26._8_4_ = 0.20000714;
    auVar26._12_4_ = 0.20000714;
    auVar26._0_4_ = 0.20000714;
    auVar26._4_4_ = 0.20000714;
    auVar26._16_4_ = 0.20000714;
    auVar26._20_4_ = 0.20000714;
    auVar26._24_4_ = 0.20000714;
    auVar26._28_4_ = 0.20000714;
    auVar3 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar3),auVar26);
    auVar27._8_4_ = -0.24999994;
    auVar27._12_4_ = -0.24999994;
    auVar27._0_4_ = -0.24999994;
    auVar27._4_4_ = -0.24999994;
    auVar27._16_4_ = -0.24999994;
    auVar27._20_4_ = -0.24999994;
    auVar27._24_4_ = -0.24999994;
    auVar27._28_4_ = -0.24999994;
    auVar3 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar3),auVar27);
    auVar28._8_4_ = 0.3333333;
    auVar28._12_4_ = 0.3333333;
    auVar28._0_4_ = 0.3333333;
    auVar28._4_4_ = 0.3333333;
    auVar28._16_4_ = 0.3333333;
    auVar28._20_4_ = 0.3333333;
    auVar28._24_4_ = 0.3333333;
    auVar28._28_4_ = 0.3333333;
    auVar3 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar3),auVar28);
    local_1c20 = auVar3._0_4_;
    fStack_1c1c = auVar3._4_4_;
    fStack_1c18 = auVar3._8_4_;
    fStack_1c14 = auVar3._12_4_;
    local_1ee0._4_4_ =
         fStack_1c1c * (float)local_1de0._4_4_ * (float)local_1de0._4_4_ * (float)local_1de0._4_4_;
    local_1ee0._0_4_ =
         local_1c20 * (float)local_1de0._0_4_ * (float)local_1de0._0_4_ * (float)local_1de0._0_4_;
    uStack_1ed8._0_4_ = fStack_1c18 * fStack_1dd8 * fStack_1dd8 * fStack_1dd8;
    uStack_1ed8._4_4_ = fStack_1c14 * fStack_1dd4 * fStack_1dd4 * fStack_1dd4;
    uStack_1ed0._0_4_ = fStack_1dd0 * 0.0 * fStack_1dd0 * fStack_1dd0;
    uStack_1ed0._4_4_ = fStack_1dcc * 0.0 * fStack_1dcc * fStack_1dcc;
    uStack_1ec8._0_4_ = fStack_1dc8 * 0.0 * fStack_1dc8 * fStack_1dc8;
    uStack_1ec8._4_4_ = 0;
    auVar29._8_4_ = -0.00021219444;
    auVar29._12_4_ = -0.00021219444;
    auVar29._0_4_ = -0.00021219444;
    auVar29._4_4_ = -0.00021219444;
    auVar29._16_4_ = -0.00021219444;
    auVar29._20_4_ = -0.00021219444;
    auVar29._24_4_ = -0.00021219444;
    auVar29._28_4_ = -0.00021219444;
    auVar3 = vfmadd213ps_fma(auVar29,auVar80,_local_1ee0);
    auVar76._4_4_ = (float)local_1de0._4_4_ * (float)local_1de0._4_4_;
    auVar76._0_4_ = (float)local_1de0._0_4_ * (float)local_1de0._0_4_;
    auVar76._8_4_ = fStack_1dd8 * fStack_1dd8;
    auVar76._12_4_ = fStack_1dd4 * fStack_1dd4;
    auVar76._16_4_ = fStack_1dd0 * fStack_1dd0;
    auVar76._20_4_ = fStack_1dcc * fStack_1dcc;
    auVar76._24_4_ = fStack_1dc8 * fStack_1dc8;
    auVar76._28_4_ = fStack_1dc4;
    auVar33._8_4_ = 0.5;
    auVar33._12_4_ = 0.5;
    auVar33._0_4_ = 0.5;
    auVar33._4_4_ = 0.5;
    auVar33._16_4_ = 0.5;
    auVar33._20_4_ = 0.5;
    auVar33._24_4_ = 0.5;
    auVar33._28_4_ = 0.5;
    auVar3 = vfnmadd213ps_fma(auVar33,auVar76,ZEXT1632(auVar3));
    local_1dc0 = auVar3._0_4_;
    fStack_1dbc = auVar3._4_4_;
    fStack_1db8 = auVar3._8_4_;
    fStack_1db4 = auVar3._12_4_;
    local_1de0._4_4_ = (float)local_1de0._4_4_ + fStack_1dbc;
    local_1de0._0_4_ = (float)local_1de0._0_4_ + local_1dc0;
    fStack_1dd8 = fStack_1dd8 + fStack_1db8;
    fStack_1dd4 = fStack_1dd4 + fStack_1db4;
    fStack_1dd0 = fStack_1dd0 + 0.0;
    fStack_1dcc = fStack_1dcc + 0.0;
    fStack_1dc8 = fStack_1dc8 + 0.0;
    fStack_1dc4 = fStack_1dc4 + 0.0;
    auVar30._8_4_ = 0.6933594;
    auVar30._12_4_ = 0.6933594;
    auVar30._0_4_ = 0.6933594;
    auVar30._4_4_ = 0.6933594;
    auVar30._16_4_ = 0.6933594;
    auVar30._20_4_ = 0.6933594;
    auVar30._24_4_ = 0.6933594;
    auVar30._28_4_ = 0.6933594;
    auVar3 = vfmadd213ps_fma(auVar30,auVar80,_local_1de0);
    auVar5 = vorps_avx(ZEXT1632(auVar3),auVar2);
    local_2180 = (float)*local_22d0;
    fStack_217c = (float)((ulong)*local_22d0 >> 0x20);
    fStack_2178 = (float)local_22d0[1];
    fStack_2174 = (float)((ulong)local_22d0[1] >> 0x20);
    fStack_2170 = (float)local_22d0[2];
    fStack_216c = (float)((ulong)local_22d0[2] >> 0x20);
    fStack_2168 = (float)local_22d0[3];
    uStack_2164 = (undefined4)((ulong)local_22d0[3] >> 0x20);
    local_21a0 = auVar5._0_4_;
    fStack_219c = auVar5._4_4_;
    fStack_2198 = auVar5._8_4_;
    fStack_2194 = auVar5._12_4_;
    fStack_2190 = auVar5._16_4_;
    fStack_218c = auVar5._20_4_;
    fStack_2188 = auVar5._24_4_;
    local_2080._4_4_ = fStack_217c * fStack_219c;
    local_2080._0_4_ = local_2180 * local_21a0;
    fStack_2078 = fStack_2178 * fStack_2198;
    fStack_2074 = fStack_2174 * fStack_2194;
    uStack_2070._0_4_ = fStack_2170 * fStack_2190;
    uStack_2070._4_4_ = fStack_216c * fStack_218c;
    uStack_2068._0_4_ = fStack_2168 * fStack_2188;
    uStack_2068._4_4_ = uStack_2164;
    auVar5 = _local_2080;
    uStack_2068 = auVar5._24_8_;
    auVar2._16_8_ = uStack_2070;
    auVar2._0_16_ = _local_2080;
    auVar2._24_8_ = uStack_2068;
    auVar5._8_8_ = 0x42b0c0a542b0c0a5;
    auVar5._0_8_ = 0x42b0c0a542b0c0a5;
    auVar5._16_8_ = 0x42b0c0a542b0c0a5;
    auVar5._24_8_ = 0x42b0c0a542b0c0a5;
    auVar5 = vminps_avx(auVar2,auVar5);
    auVar80._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar80._16_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar80._24_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar80 = vmaxps_avx(auVar5,auVar80);
    auVar15._8_4_ = 1.442695;
    auVar15._12_4_ = 1.442695;
    auVar15._0_4_ = 1.442695;
    auVar15._4_4_ = 1.442695;
    auVar15._16_4_ = 1.442695;
    auVar15._20_4_ = 1.442695;
    auVar15._24_4_ = 1.442695;
    auVar15._28_4_ = 1.442695;
    auVar14._8_4_ = 0.5;
    auVar14._12_4_ = 0.5;
    auVar14._0_4_ = 0.5;
    auVar14._4_4_ = 0.5;
    auVar14._16_4_ = 0.5;
    auVar14._20_4_ = 0.5;
    auVar14._24_4_ = 0.5;
    auVar14._28_4_ = 0.5;
    auVar3 = vfmadd213ps_fma(auVar15,auVar80,auVar14);
    auVar2 = vroundps_avx(ZEXT1632(auVar3),1);
    auVar5 = vcmpps_avx(ZEXT1632(auVar3),auVar2,1);
    auVar13._8_8_ = 0x3f8000003f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._16_8_ = 0x3f8000003f800000;
    auVar13._24_8_ = 0x3f8000003f800000;
    auVar5 = vandps_avx(auVar5,auVar13);
    auVar5 = vsubps_avx(auVar2,auVar5);
    auVar31._8_4_ = 0.6933594;
    auVar31._12_4_ = 0.6933594;
    auVar31._0_4_ = 0.6933594;
    auVar31._4_4_ = 0.6933594;
    auVar31._16_4_ = 0.6933594;
    auVar31._20_4_ = 0.6933594;
    auVar31._24_4_ = 0.6933594;
    auVar31._28_4_ = 0.6933594;
    auVar3 = vfnmadd213ps_fma(auVar31,auVar5,auVar80);
    auVar32._8_4_ = -0.00021219444;
    auVar32._12_4_ = -0.00021219444;
    auVar32._0_4_ = -0.00021219444;
    auVar32._4_4_ = -0.00021219444;
    auVar32._16_4_ = -0.00021219444;
    auVar32._20_4_ = -0.00021219444;
    auVar32._24_4_ = -0.00021219444;
    auVar32._28_4_ = -0.00021219444;
    auVar3 = vfnmadd213ps_fma(auVar32,auVar5,ZEXT1632(auVar3));
    auVar80 = ZEXT1632(auVar3);
    local_1f80 = auVar3._0_4_;
    fStack_1f7c = auVar3._4_4_;
    fStack_1f78 = auVar3._8_4_;
    fStack_1f74 = auVar3._12_4_;
    _local_20a0 = ZEXT1632(CONCAT412(fStack_1f74 * fStack_1f74,
                                     CONCAT48(fStack_1f78 * fStack_1f78,
                                              CONCAT44(fStack_1f7c * fStack_1f7c,
                                                       local_1f80 * local_1f80))));
    uStack_2138 = 0x3950696739506967;
    local_2140 = (undefined1  [8])0x3950696739506967;
    uStack_2130 = 0x3950696739506967;
    uStack_2128 = 0x3950696739506967;
    auVar16._8_4_ = 0.0013981999;
    auVar16._12_4_ = 0.0013981999;
    auVar16._0_4_ = 0.0013981999;
    auVar16._4_4_ = 0.0013981999;
    auVar16._16_4_ = 0.0013981999;
    auVar16._20_4_ = 0.0013981999;
    auVar16._24_4_ = 0.0013981999;
    auVar16._28_4_ = 0.0013981999;
    auVar3 = vfmadd213ps_fma(auVar80,_local_2140,auVar16);
    auVar17._8_4_ = 0.008333452;
    auVar17._12_4_ = 0.008333452;
    auVar17._0_4_ = 0.008333452;
    auVar17._4_4_ = 0.008333452;
    auVar17._16_4_ = 0.008333452;
    auVar17._20_4_ = 0.008333452;
    auVar17._24_4_ = 0.008333452;
    auVar17._28_4_ = 0.008333452;
    auVar3 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar3),auVar17);
    auVar18._8_4_ = 0.041665796;
    auVar18._12_4_ = 0.041665796;
    auVar18._0_4_ = 0.041665796;
    auVar18._4_4_ = 0.041665796;
    auVar18._16_4_ = 0.041665796;
    auVar18._20_4_ = 0.041665796;
    auVar18._24_4_ = 0.041665796;
    auVar18._28_4_ = 0.041665796;
    auVar3 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar3),auVar18);
    auVar19._8_4_ = 0.16666666;
    auVar19._12_4_ = 0.16666666;
    auVar19._0_4_ = 0.16666666;
    auVar19._4_4_ = 0.16666666;
    auVar19._16_4_ = 0.16666666;
    auVar19._20_4_ = 0.16666666;
    auVar19._24_4_ = 0.16666666;
    auVar19._28_4_ = 0.16666666;
    auVar3 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar3),auVar19);
    auVar20._8_4_ = 0.5;
    auVar20._12_4_ = 0.5;
    auVar20._0_4_ = 0.5;
    auVar20._4_4_ = 0.5;
    auVar20._16_4_ = 0.5;
    auVar20._20_4_ = 0.5;
    auVar20._24_4_ = 0.5;
    auVar20._28_4_ = 0.5;
    auVar3 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar3),auVar20);
    auVar3 = vfmadd213ps_fma(_local_20a0,ZEXT1632(auVar3),auVar80);
    local_2040 = auVar3._0_4_;
    fStack_203c = auVar3._4_4_;
    fStack_2038 = auVar3._8_4_;
    fStack_2034 = auVar3._12_4_;
    local_1840 = auVar5._0_4_;
    fStack_183c = auVar5._4_4_;
    fStack_1838 = auVar5._8_4_;
    fStack_1834 = auVar5._12_4_;
    fStack_1830 = auVar5._16_4_;
    fStack_182c = auVar5._20_4_;
    fStack_1828 = auVar5._24_4_;
    fStack_1824 = auVar5._28_4_;
    local_20e0 = CONCAT44((int)fStack_183c,(int)local_1840);
    uStack_20d8 = CONCAT44((int)fStack_1834,(int)fStack_1838);
    uStack_20d0 = CONCAT44((int)fStack_182c,(int)fStack_1830);
    uStack_20c8 = CONCAT44((int)fStack_1824,(int)fStack_1828);
    auVar34._8_8_ = uStack_20d8;
    auVar34._0_8_ = local_20e0;
    auVar3._8_8_ = 0x7f0000007f;
    auVar3._0_8_ = 0x7f0000007f;
    auVar3 = vpaddd_avx(auVar34,auVar3);
    auVar7._8_8_ = uStack_20c8;
    auVar7._0_8_ = uStack_20d0;
    auVar8._8_8_ = 0x7f0000007f;
    auVar8._0_8_ = 0x7f0000007f;
    auVar8 = vpaddd_avx(auVar7,auVar8);
    auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
    auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
    local_1fe0 = auVar3._0_4_;
    fStack_1fdc = auVar3._4_4_;
    fStack_1fd8 = auVar3._8_4_;
    fStack_1fd4 = auVar3._12_4_;
    fStack_1fd0 = auVar8._0_4_;
    fStack_1fcc = auVar8._4_4_;
    fStack_1fc8 = auVar8._8_4_;
    local_2140._4_4_ = (fStack_203c + 1.0) * fStack_1fdc;
    local_2140._0_4_ = (local_2040 + 1.0) * local_1fe0;
    uStack_2138._0_4_ = (fStack_2038 + 1.0) * fStack_1fd8;
    uStack_2138._4_4_ = (fStack_2034 + 1.0) * fStack_1fd4;
    uStack_2130._0_4_ = fStack_1fd0 * 1.0;
    uStack_2130._4_4_ = fStack_1fcc * 1.0;
    auVar78 = _local_2140;
    uStack_2128._0_4_ = fStack_1fc8 * 1.0;
    uStack_2128._4_4_ = 0x3f800000;
    auVar5 = _local_2140;
    uStack_2130 = auVar78._16_8_;
    uStack_2128 = auVar5._24_8_;
    *local_22e0 = local_2140;
    local_22e0[1] = uStack_2138;
    local_22e0[2] = uStack_2130;
    local_22e0[3] = uStack_2128;
    local_22d0 = local_22d0 + 4;
    local_22e0 = local_22e0 + 4;
  }
  uVar1 = *in_RSI;
  for (; local_22f4 + 3 < in_ECX * in_R8D; local_22f4 = local_22f4 + 4) {
    auVar73._8_8_ = CONCAT44(uVar1,uVar1);
    auVar73._0_8_ = CONCAT44(uVar1,uVar1);
    auVar72._8_8_ = CONCAT44(uVar1,uVar1);
    auVar72._0_8_ = CONCAT44(uVar1,uVar1);
    auVar3 = vcmpps_avx(auVar73,ZEXT816(0),2);
    auVar45._8_8_ = 0x80000000800000;
    auVar45._0_8_ = 0x80000000800000;
    auVar4 = vmaxps_avx(auVar72,auVar45);
    auVar8 = vpsrld_avx(auVar4,ZEXT416(0x17));
    auVar50._8_8_ = 0x807fffff807fffff;
    auVar50._0_8_ = 0x807fffff807fffff;
    auVar4 = vpand_avx(auVar4,auVar50);
    auVar70._8_8_ = 0x3f0000003f000000;
    auVar70._0_8_ = 0x3f0000003f000000;
    auVar7 = vpor_avx(auVar4,auVar70);
    auVar46._8_8_ = 0x7f0000007f;
    auVar46._0_8_ = 0x7f0000007f;
    auVar4 = vpsubd_avx(auVar8,auVar46);
    auVar4 = vcvtdq2ps_avx(auVar4);
    local_840 = auVar4._0_4_;
    fStack_83c = auVar4._4_4_;
    fStack_838 = auVar4._8_4_;
    fStack_834 = auVar4._12_4_;
    local_8e0 = CONCAT44(fStack_83c + 1.0,local_840 + 1.0);
    uStack_8d8._0_4_ = fStack_838 + 1.0;
    uStack_8d8._4_4_ = fStack_834 + 1.0;
    auVar71._8_8_ = 0x3f3504f33f3504f3;
    auVar71._0_8_ = 0x3f3504f33f3504f3;
    auVar4 = vcmpps_avx(auVar7,auVar71,1);
    auVar8 = vpand_avx(auVar7,auVar4);
    auVar44._8_8_ = 0x3f8000003f800000;
    auVar44._0_8_ = 0x3f8000003f800000;
    auVar7 = vsubps_avx(auVar7,auVar44);
    auVar49._8_8_ = 0x3f8000003f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    auVar4 = vpand_avx(auVar49,auVar4);
    auVar43._8_8_ = uStack_8d8;
    auVar43._0_8_ = local_8e0;
    auVar4 = vsubps_avx(auVar43,auVar4);
    local_860 = auVar7._0_4_;
    fStack_85c = auVar7._4_4_;
    fStack_858 = auVar7._8_4_;
    fStack_854 = auVar7._12_4_;
    local_870 = auVar8._0_4_;
    fStack_86c = auVar8._4_4_;
    fStack_868 = auVar8._8_4_;
    fStack_864 = auVar8._12_4_;
    local_8a0._0_4_ = local_860 + local_870;
    local_8a0._4_4_ = fStack_85c + fStack_86c;
    fStack_898 = fStack_858 + fStack_868;
    fStack_894 = fStack_854 + fStack_864;
    uStack_918 = 0x3d9021bb3d9021bb;
    local_920 = (undefined1  [8])0x3d9021bb3d9021bb;
    auVar60._8_4_ = -0.1151461;
    auVar60._12_4_ = -0.1151461;
    auVar60._0_4_ = -0.1151461;
    auVar60._4_4_ = -0.1151461;
    auVar8 = vfmadd213ps_fma(_local_8a0,_local_920,auVar60);
    auVar61._8_4_ = 0.116769984;
    auVar61._12_4_ = 0.116769984;
    auVar61._0_4_ = 0.116769984;
    auVar61._4_4_ = 0.116769984;
    auVar8 = vfmadd213ps_fma(_local_8a0,auVar8,auVar61);
    auVar62._8_4_ = -0.12420141;
    auVar62._12_4_ = -0.12420141;
    auVar62._0_4_ = -0.12420141;
    auVar62._4_4_ = -0.12420141;
    auVar8 = vfmadd213ps_fma(_local_8a0,auVar8,auVar62);
    auVar63._8_4_ = 0.14249323;
    auVar63._12_4_ = 0.14249323;
    auVar63._0_4_ = 0.14249323;
    auVar63._4_4_ = 0.14249323;
    auVar8 = vfmadd213ps_fma(_local_8a0,auVar8,auVar63);
    auVar64._8_4_ = -0.16668057;
    auVar64._12_4_ = -0.16668057;
    auVar64._0_4_ = -0.16668057;
    auVar64._4_4_ = -0.16668057;
    auVar8 = vfmadd213ps_fma(_local_8a0,auVar8,auVar64);
    auVar65._8_4_ = 0.20000714;
    auVar65._12_4_ = 0.20000714;
    auVar65._0_4_ = 0.20000714;
    auVar65._4_4_ = 0.20000714;
    auVar8 = vfmadd213ps_fma(_local_8a0,auVar8,auVar65);
    auVar66._8_4_ = -0.24999994;
    auVar66._12_4_ = -0.24999994;
    auVar66._0_4_ = -0.24999994;
    auVar66._4_4_ = -0.24999994;
    auVar8 = vfmadd213ps_fma(_local_8a0,auVar8,auVar66);
    auVar67._8_4_ = 0.3333333;
    auVar67._12_4_ = 0.3333333;
    auVar67._0_4_ = 0.3333333;
    auVar67._4_4_ = 0.3333333;
    auVar8 = vfmadd213ps_fma(_local_8a0,auVar8,auVar67);
    local_7c0 = auVar8._0_4_;
    fStack_7bc = auVar8._4_4_;
    fStack_7b8 = auVar8._8_4_;
    fStack_7b4 = auVar8._12_4_;
    local_920._4_4_ =
         fStack_7bc * (float)local_8a0._4_4_ * (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
    local_920._0_4_ =
         local_7c0 * (float)local_8a0._0_4_ * (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
    uStack_918._0_4_ = fStack_7b8 * fStack_898 * fStack_898 * fStack_898;
    uStack_918._4_4_ = fStack_7b4 * fStack_894 * fStack_894 * fStack_894;
    auVar68._8_4_ = -0.00021219444;
    auVar68._12_4_ = -0.00021219444;
    auVar68._0_4_ = -0.00021219444;
    auVar68._4_4_ = -0.00021219444;
    auVar8 = vfmadd213ps_fma(auVar68,auVar4,_local_920);
    auVar77._4_4_ = (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
    auVar77._0_4_ = (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
    auVar77._8_4_ = fStack_898 * fStack_898;
    auVar77._12_4_ = fStack_894 * fStack_894;
    auVar54._8_4_ = 0.5;
    auVar54._12_4_ = 0.5;
    auVar54._0_4_ = 0.5;
    auVar54._4_4_ = 0.5;
    auVar8 = vfnmadd213ps_fma(auVar54,auVar77,auVar8);
    local_890 = auVar8._0_4_;
    fStack_88c = auVar8._4_4_;
    fStack_888 = auVar8._8_4_;
    fStack_884 = auVar8._12_4_;
    local_8a0._4_4_ = (float)local_8a0._4_4_ + fStack_88c;
    local_8a0._0_4_ = (float)local_8a0._0_4_ + local_890;
    fStack_898 = fStack_898 + fStack_888;
    fStack_894 = fStack_894 + fStack_884;
    auVar69._8_4_ = 0.6933594;
    auVar69._12_4_ = 0.6933594;
    auVar69._0_4_ = 0.6933594;
    auVar69._4_4_ = 0.6933594;
    auVar4 = vfmadd213ps_fma(auVar69,auVar4,_local_8a0);
    auVar3 = vpor_avx(auVar4,auVar3);
    local_af0 = (float)*local_22d0;
    fStack_aec = (float)((ulong)*local_22d0 >> 0x20);
    fStack_ae8 = (float)local_22d0[1];
    fStack_ae4 = (float)((ulong)local_22d0[1] >> 0x20);
    local_b00 = auVar3._0_4_;
    fStack_afc = auVar3._4_4_;
    fStack_af8 = auVar3._8_4_;
    fStack_af4 = auVar3._12_4_;
    local_a70 = CONCAT44(fStack_aec * fStack_afc,local_af0 * local_b00);
    uStack_a68._0_4_ = fStack_ae8 * fStack_af8;
    uStack_a68._4_4_ = fStack_ae4 * fStack_af4;
    auVar40._8_8_ = uStack_a68;
    auVar40._0_8_ = local_a70;
    auVar39._8_8_ = 0x42b0c0a542b0c0a5;
    auVar39._0_8_ = 0x42b0c0a542b0c0a5;
    auVar3 = vminps_avx(auVar40,auVar39);
    auVar4._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar4._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar8 = vmaxps_avx(auVar3,auVar4);
    local_9b0 = auVar8._0_4_;
    fStack_9ac = auVar8._4_4_;
    fStack_9a8 = auVar8._8_4_;
    fStack_9a4 = auVar8._12_4_;
    fVar79 = local_9b0 * 1.442695 + 0.5;
    fVar81 = fStack_9ac * 1.442695 + 0.5;
    fVar82 = fStack_9a8 * 1.442695 + 0.5;
    fVar83 = fStack_9a4 * 1.442695 + 0.5;
    local_a90 = CONCAT44(fVar81,fVar79);
    uStack_a88._0_4_ = fVar82;
    uStack_a88._4_4_ = fVar83;
    local_aa0 = CONCAT44((int)fVar81,(int)fVar79);
    uStack_a98._0_4_ = (int)fVar82;
    uStack_a98._4_4_ = (int)fVar83;
    auVar47._8_8_ = uStack_a98;
    auVar47._0_8_ = local_aa0;
    auVar4 = vcvtdq2ps_avx(auVar47);
    auVar48._8_8_ = uStack_a88;
    auVar48._0_8_ = local_a90;
    auVar3 = vcmpps_avx(auVar48,auVar4,1);
    auVar51._8_8_ = 0x3f8000003f800000;
    auVar51._0_8_ = 0x3f8000003f800000;
    auVar3 = vpand_avx(auVar3,auVar51);
    auVar3 = vsubps_avx(auVar4,auVar3);
    auVar52._8_4_ = 0.6933594;
    auVar52._12_4_ = 0.6933594;
    auVar52._0_4_ = 0.6933594;
    auVar52._4_4_ = 0.6933594;
    auVar4 = vfnmadd213ps_fma(auVar52,auVar3,auVar8);
    auVar53._8_4_ = -0.00021219444;
    auVar53._12_4_ = -0.00021219444;
    auVar53._0_4_ = -0.00021219444;
    auVar53._4_4_ = -0.00021219444;
    auVar8 = vfnmadd213ps_fma(auVar53,auVar3,auVar4);
    local_9d0 = auVar8._0_4_;
    fStack_9cc = auVar8._4_4_;
    fStack_9c8 = auVar8._8_4_;
    fStack_9c4 = auVar8._12_4_;
    local_a80._4_4_ = fStack_9cc * fStack_9cc;
    local_a80._0_4_ = local_9d0 * local_9d0;
    fStack_a78 = fStack_9c8 * fStack_9c8;
    fStack_a74 = fStack_9c4 * fStack_9c4;
    uStack_ac8 = 0x3950696739506967;
    local_ad0 = (undefined1  [8])0x3950696739506967;
    auVar55._8_4_ = 0.0013981999;
    auVar55._12_4_ = 0.0013981999;
    auVar55._0_4_ = 0.0013981999;
    auVar55._4_4_ = 0.0013981999;
    auVar4 = vfmadd213ps_fma(auVar8,_local_ad0,auVar55);
    auVar56._8_4_ = 0.008333452;
    auVar56._12_4_ = 0.008333452;
    auVar56._0_4_ = 0.008333452;
    auVar56._4_4_ = 0.008333452;
    auVar4 = vfmadd213ps_fma(auVar8,auVar4,auVar56);
    auVar57._8_4_ = 0.041665796;
    auVar57._12_4_ = 0.041665796;
    auVar57._0_4_ = 0.041665796;
    auVar57._4_4_ = 0.041665796;
    auVar4 = vfmadd213ps_fma(auVar8,auVar4,auVar57);
    auVar58._8_4_ = 0.16666666;
    auVar58._12_4_ = 0.16666666;
    auVar58._0_4_ = 0.16666666;
    auVar58._4_4_ = 0.16666666;
    auVar4 = vfmadd213ps_fma(auVar8,auVar4,auVar58);
    auVar59._8_4_ = 0.5;
    auVar59._12_4_ = 0.5;
    auVar59._0_4_ = 0.5;
    auVar59._4_4_ = 0.5;
    auVar4 = vfmadd213ps_fma(auVar8,auVar4,auVar59);
    auVar4 = vfmadd213ps_fma(_local_a80,auVar4,auVar8);
    local_a50 = auVar4._0_4_;
    fStack_a4c = auVar4._4_4_;
    fStack_a48 = auVar4._8_4_;
    fStack_a44 = auVar4._12_4_;
    local_710 = auVar3._0_4_;
    fStack_70c = auVar3._4_4_;
    fStack_708 = auVar3._8_4_;
    fStack_704 = auVar3._12_4_;
    local_aa0 = CONCAT44((int)fStack_70c,(int)local_710);
    uStack_a98._0_4_ = (int)fStack_708;
    uStack_a98._4_4_ = (int)fStack_704;
    auVar42._8_8_ = uStack_a98;
    auVar42._0_8_ = local_aa0;
    auVar41._8_8_ = 0x7f0000007f;
    auVar41._0_8_ = 0x7f0000007f;
    auVar3 = vpaddd_avx(auVar42,auVar41);
    auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
    local_a00 = auVar3._0_4_;
    fStack_9fc = auVar3._4_4_;
    fStack_9f8 = auVar3._8_4_;
    fStack_9f4 = auVar3._12_4_;
    local_ad0._4_4_ = (fStack_a4c + 1.0) * fStack_9fc;
    local_ad0._0_4_ = (local_a50 + 1.0) * local_a00;
    uStack_ac8._0_4_ = (fStack_a48 + 1.0) * fStack_9f8;
    uStack_ac8._4_4_ = (fStack_a44 + 1.0) * fStack_9f4;
    *local_22e0 = local_ad0;
    local_22e0[1] = uStack_ac8;
    local_22d0 = local_22d0 + 2;
    local_22e0 = local_22e0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}